

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

int sptk::world::cfttree(int n,int j,int k,double *a,int nw,double *w)

{
  uint uVar1;
  uint in_EDX;
  int in_EDI;
  undefined8 in_R9;
  int m;
  int isplt;
  int i;
  undefined4 in_stack_00000018;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd4;
  
  if ((in_EDX & 3) == 0) {
    for (; (in_EDX & 3) == 0; in_EDX = (int)in_EDX >> 2) {
      in_EDI = in_EDI << 2;
    }
    uVar1 = in_EDX & 1;
    if (uVar1 == 0) {
      for (; 0x80 < in_EDI; in_EDI = in_EDI >> 2) {
        cftmdl2(a._4_4_,(double *)CONCAT44(nw,in_stack_00000018),w);
      }
    }
    else {
      for (; 0x80 < in_EDI; in_EDI = in_EDI >> 2) {
        cftmdl1((int)((ulong)in_R9 >> 0x20),(double *)CONCAT44(in_EDX,uVar1),
                (double *)CONCAT44(in_EDI,in_stack_ffffffffffffffc8));
      }
    }
  }
  else {
    uVar1 = in_EDX & 1;
    if (uVar1 == 0) {
      cftmdl2(a._4_4_,(double *)CONCAT44(nw,in_stack_00000018),w);
    }
    else {
      cftmdl1((int)((ulong)in_R9 >> 0x20),
              (double *)(CONCAT44(in_stack_ffffffffffffffd4,in_EDX) & 0xffffffff00000001),
              (double *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
  }
  return uVar1;
}

Assistant:

int cfttree(int n, int j, int k, double *a, int nw, double *w) {
#if 0
  void cftmdl1(int n, double *a, double *w);
  void cftmdl2(int n, double *a, double *w);
#endif
  int i, isplt, m;

  if ((k & 3) != 0) {
    isplt = k & 1;
    if (isplt != 0) {
      cftmdl1(n, &a[j - n], &w[nw - (n >> 1)]);
    } else {
      cftmdl2(n, &a[j - n], &w[nw - n]);
    }
  } else {
    m = n;
    for (i = k; (i & 3) == 0; i >>= 2) {
      m <<= 2;
    }
    isplt = i & 1;
    if (isplt != 0) {
      while (m > 128) {
        cftmdl1(m, &a[j - m], &w[nw - (m >> 1)]);
        m >>= 2;
      }
    } else {
      while (m > 128) {
        cftmdl2(m, &a[j - m], &w[nw - m]);
        m >>= 2;
      }
    }
  }
  return isplt;
}